

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

void __thiscall
Highs::getRowsInterface
          (Highs *this,HighsIndexCollection *index_collection,HighsInt *num_row,double *lower,
          double *upper,HighsInt *num_nz,HighsInt *start,HighsInt *index,double *value)

{
  bool bVar1;
  double *pdVar2;
  HighsInt *in_RCX;
  HighsInt *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double *in_R9;
  HighsSparseMatrix *in_stack_00000010;
  double *in_stack_00000018;
  HighsSparseMatrix *in_stack_00000028;
  double *in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  HighsInt in_stack_0000004c;
  HighsIndexCollection *in_stack_00000050;
  HighsInt *in_stack_00000060;
  double *in_stack_00000068;
  HighsLp *lp;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 uVar3;
  HighsIndexCollection *in_stack_ffffffffffffff90;
  HighsInt *in_stack_ffffffffffffffa0;
  double *sub_vector_data0;
  double *sub_matrix_index;
  HighsInt data_dim;
  
  sub_vector_data0 = in_RDI + 0x27;
  bVar1 = HighsSparseMatrix::isColwise((HighsSparseMatrix *)(in_RDI + 0x37));
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dad47);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dad5a);
    getSubVectorsTranspose
              (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_00000038,
               in_stack_00000030,in_stack_00000028,in_stack_00000060,in_stack_00000068,(double *)lp,
               (double *)num_nz,(HighsInt *)upper,(HighsInt *)lower,num_row,
               (double *)index_collection);
  }
  else {
    uVar3 = *(undefined4 *)((long)sub_vector_data0 + 4);
    sub_matrix_index = in_RSI;
    pdVar2 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x4dae0a);
    data_dim = (HighsInt)((ulong)pdVar2 >> 0x20);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x4dae1d);
    getSubVectors(in_stack_ffffffffffffff90,data_dim,
                  (double *)CONCAT44(uVar3,in_stack_ffffffffffffff80),in_RSI,in_stack_00000018,
                  in_stack_00000010,in_stack_ffffffffffffffa0,sub_vector_data0,in_R9,in_R8,in_RCX,
                  in_RDX,(HighsInt *)sub_matrix_index,in_RDI);
  }
  return;
}

Assistant:

void Highs::getRowsInterface(const HighsIndexCollection& index_collection,
                             HighsInt& num_row, double* lower, double* upper,
                             HighsInt& num_nz, HighsInt* start, HighsInt* index,
                             double* value) const {
  const HighsLp& lp = model_.lp_;
  if (lp.a_matrix_.isColwise()) {
    getSubVectorsTranspose(index_collection, lp.num_row_, nullptr,
                           lp.row_lower_.data(), lp.row_upper_.data(),
                           lp.a_matrix_, num_row, nullptr, lower, upper, num_nz,
                           start, index, value);
  } else {
    getSubVectors(index_collection, lp.num_row_, nullptr, lp.row_lower_.data(),
                  lp.row_upper_.data(), lp.a_matrix_, num_row, nullptr, lower,
                  upper, num_nz, start, index, value);
  }
}